

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_sRGB(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  byte local_1d;
  png_uint_32 local_1c;
  png_byte intent;
  png_inforp ppStack_18;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  local_1c = length;
  ppStack_18 = info_ptr;
  info_ptr_local = (png_inforp)png_ptr;
  if ((png_ptr->mode & 1) != 0) {
    if ((png_ptr->mode & 6) == 0) {
      if (length == 1) {
        png_crc_read(png_ptr,&local_1d,1);
        iVar4 = png_crc_finish((png_structrp)info_ptr_local,0);
        if ((iVar4 == 0) &&
           (uVar1._0_1_ = info_ptr_local[3].sig_bit.blue,
           uVar1._1_1_ = info_ptr_local[3].sig_bit.gray, (uVar1 & 0x8000) == 0)) {
          uVar2._0_1_ = info_ptr_local[3].sig_bit.blue;
          uVar2._1_1_ = info_ptr_local[3].sig_bit.gray;
          if ((uVar2 & 4) == 0) {
            png_colorspace_set_sRGB
                      ((png_const_structrp)info_ptr_local,
                       (png_colorspacerp)&info_ptr_local[3].colorspace.end_points_XYZ.green_Y,
                       (uint)local_1d);
            png_colorspace_sync((png_const_structrp)info_ptr_local,ppStack_18);
          }
          else {
            uVar3._0_1_ = info_ptr_local[3].sig_bit.blue;
            uVar3._1_1_ = info_ptr_local[3].sig_bit.gray;
            info_ptr_local[3].sig_bit.blue = (char)(uVar3 | 0x8000);
            info_ptr_local[3].sig_bit.gray = (char)((uVar3 | 0x8000) >> 8);
            png_colorspace_sync((png_const_structrp)info_ptr_local,ppStack_18);
            png_chunk_benign_error((png_const_structrp)info_ptr_local,"too many profiles");
          }
        }
      }
      else {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error((png_const_structrp)info_ptr_local,"invalid");
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error((png_const_structrp)info_ptr_local,"out of place");
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_sRGB(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte intent;

   png_debug(1, "in png_handle_sRGB");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   if (length != 1)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, &intent, 1);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* If a colorspace error has already been output skip this chunk */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) != 0)
      return;

   /* Only one sRGB or iCCP chunk is allowed, use the HAVE_INTENT flag to detect
    * this.
    */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_INTENT) != 0)
   {
      png_ptr->colorspace.flags |= PNG_COLORSPACE_INVALID;
      png_colorspace_sync(png_ptr, info_ptr);
      png_chunk_benign_error(png_ptr, "too many profiles");
      return;
   }

   (void)png_colorspace_set_sRGB(png_ptr, &png_ptr->colorspace, intent);
   png_colorspace_sync(png_ptr, info_ptr);
}